

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

ErrCode __thiscall HttpHeaderBase::removeField(HttpHeaderBase *this,FieldType type)

{
  undefined4 uVar1;
  HeaderField *pHVar2;
  HeaderField *pHVar3;
  int local_24;
  int local_20;
  int j;
  int i;
  FieldType type_local;
  HttpHeaderBase *this_local;
  
  local_20 = 0;
  while( true ) {
    if (this->mNumFields <= local_20) {
      return kNotFound;
    }
    if (this->mFields[local_20].mType == type) break;
    local_20 = local_20 + 1;
  }
  for (local_24 = local_20; local_24 < this->mNumFields + -1; local_24 = local_24 + 1) {
    pHVar3 = this->mFields + (local_24 + 1);
    pHVar2 = this->mFields + local_24;
    uVar1 = *(undefined4 *)&pHVar3->field_0x4;
    pHVar2->mType = pHVar3->mType;
    *(undefined4 *)&pHVar2->field_0x4 = uVar1;
    pHVar2->mData = pHVar3->mData;
  }
  this->mFields[this->mNumFields + -1].mData = (char *)0x0;
  this->mNumFields = this->mNumFields + -1;
  return kNoError;
}

Assistant:

ErrCode HttpHeaderBase::removeField(FieldMap::FieldType type)
{
	TRACE_BEGIN(LOG_LVL_NOISE);

	for (int i = 0; i < mNumFields; i++)
	{
		if (mFields[i].mType == type)
		{
			for (int j = i; j < mNumFields - 1; j++)
			{
				mFields[j] = mFields[j + 1];
			}
			mFields[mNumFields - 1].mData = NULL;
			mNumFields--;
			return JetHead::kNoError;
		}
	}
	return JetHead::kNotFound;
}